

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

int mu_mouse_over(mu_Context *ctx,mu_Rect rect)

{
  mu_Container *pmVar1;
  int iVar2;
  long lVar3;
  mu_Rect mVar4;
  
  iVar2 = (ctx->mouse_pos).x;
  if ((rect.x <= iVar2) && (iVar2 < rect.w + rect.x)) {
    iVar2 = (ctx->mouse_pos).y;
    if ((rect.y <= iVar2) && (iVar2 < rect.h + rect.y)) {
      mVar4 = mu_get_clip_rect(ctx);
      iVar2 = (ctx->mouse_pos).x;
      if ((mVar4.x <= iVar2) && (iVar2 < mVar4.w + mVar4.x)) {
        iVar2 = (ctx->mouse_pos).y;
        if ((mVar4.y <= iVar2) && (iVar2 < mVar4.h + mVar4.y)) {
          lVar3 = (long)(ctx->container_stack).idx;
          do {
            if (lVar3 == 0) {
              return 0;
            }
            pmVar1 = (ctx->container_stack).items[lVar3 + -1];
            if (pmVar1 == ctx->hover_root) {
              return 1;
            }
            lVar3 = lVar3 + -1;
          } while (pmVar1->head == (mu_Command *)0x0);
        }
      }
    }
  }
  return 0;
}

Assistant:

int mu_mouse_over(mu_Context *ctx, mu_Rect rect) {
  return rect_overlaps_vec2(rect, ctx->mouse_pos) &&
    rect_overlaps_vec2(mu_get_clip_rect(ctx), ctx->mouse_pos) &&
    in_hover_root(ctx);
}